

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode.c
# Opt level: O2

int CVodeRootInit(void *cvode_mem,int nrtfn,CVRootFn g)

{
  long lVar1;
  uint uVar2;
  void *__ptr;
  void *__ptr_00;
  void *__ptr_01;
  void *__ptr_02;
  void *__ptr_03;
  void *pvVar3;
  int line;
  ulong uVar4;
  int error_code;
  char *msgfmt;
  uint uVar5;
  size_t sVar6;
  undefined1 auVar7 [16];
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "cvode_mem = NULL illegal.";
    error_code = -0x15;
    cvode_mem = (CVodeMem)0x0;
    line = 0x336;
  }
  else {
    uVar5 = 0;
    if (0 < nrtfn) {
      uVar5 = nrtfn;
    }
    uVar2 = *(uint *)((long)cvode_mem + 0x568);
    if (0 < (int)uVar2 && uVar5 != uVar2) {
      free(*(void **)((long)cvode_mem + 0x598));
      *(undefined8 *)((long)cvode_mem + 0x598) = 0;
      free(*(void **)((long)cvode_mem + 0x5a0));
      *(undefined8 *)((long)cvode_mem + 0x5a0) = 0;
      free(*(void **)((long)cvode_mem + 0x5a8));
      *(undefined8 *)((long)cvode_mem + 0x5a8) = 0;
      free(*(void **)((long)cvode_mem + 0x570));
      *(undefined8 *)((long)cvode_mem + 0x570) = 0;
      free(*(void **)((long)cvode_mem + 0x578));
      *(undefined8 *)((long)cvode_mem + 0x578) = 0;
      free(*(void **)((long)cvode_mem + 0x5d0));
      *(undefined8 *)((long)cvode_mem + 0x5d0) = 0;
      uVar2 = *(uint *)((long)cvode_mem + 0x568);
      lVar1 = (long)(int)uVar2 * 3;
      auVar7._8_4_ = (int)lVar1;
      auVar7._0_8_ = lVar1;
      auVar7._12_4_ = (int)((ulong)lVar1 >> 0x20);
      *(long *)((long)cvode_mem + 0x3c0) =
           *(long *)((long)cvode_mem + 0x3c0) + (long)(int)uVar2 * -3;
      *(long *)((long)cvode_mem + 0x3c8) = *(long *)((long)cvode_mem + 0x3c8) - auVar7._8_8_;
    }
    if (nrtfn < 1) {
      *(undefined4 *)((long)cvode_mem + 0x568) = 0;
      *(undefined8 *)((long)cvode_mem + 0x560) = 0;
      return 0;
    }
    if (uVar5 == uVar2) {
      if (*(CVRootFn *)((long)cvode_mem + 0x560) == g) {
        return 0;
      }
      if (g != (CVRootFn)0x0) {
        *(CVRootFn *)((long)cvode_mem + 0x560) = g;
        return 0;
      }
      free(*(void **)((long)cvode_mem + 0x598));
      *(undefined8 *)((long)cvode_mem + 0x598) = 0;
      free(*(void **)((long)cvode_mem + 0x5a0));
      *(undefined8 *)((long)cvode_mem + 0x5a0) = 0;
      free(*(void **)((long)cvode_mem + 0x5a8));
      *(undefined8 *)((long)cvode_mem + 0x5a8) = 0;
      free(*(void **)((long)cvode_mem + 0x570));
      *(undefined8 *)((long)cvode_mem + 0x570) = 0;
      free(*(void **)((long)cvode_mem + 0x578));
      *(undefined8 *)((long)cvode_mem + 0x578) = 0;
      free(*(void **)((long)cvode_mem + 0x5d0));
      *(undefined8 *)((long)cvode_mem + 0x5d0) = 0;
      *(ulong *)((long)cvode_mem + 0x3c0) = *(long *)((long)cvode_mem + 0x3c0) - (ulong)(uVar5 * 3);
      *(ulong *)((long)cvode_mem + 0x3c8) = *(long *)((long)cvode_mem + 0x3c8) - (ulong)(uVar5 * 3);
      msgfmt = "g = NULL illegal.";
      error_code = -0x16;
      line = 0x377;
    }
    else {
      *(uint *)((long)cvode_mem + 0x568) = uVar5;
      if (g == (CVRootFn)0x0) {
        msgfmt = "g = NULL illegal.";
        error_code = -0x16;
        line = 0x388;
      }
      else {
        *(CVRootFn *)((long)cvode_mem + 0x560) = g;
        sVar6 = (ulong)uVar5 * 8;
        __ptr = malloc(sVar6);
        *(void **)((long)cvode_mem + 0x598) = __ptr;
        if (__ptr == (void *)0x0) {
          msgfmt = "A memory request failed.";
          error_code = -0x14;
          line = 0x393;
        }
        else {
          __ptr_00 = malloc(sVar6);
          *(void **)((long)cvode_mem + 0x5a0) = __ptr_00;
          if (__ptr_00 == (void *)0x0) {
            free(__ptr);
            *(undefined8 *)((long)cvode_mem + 0x598) = 0;
            msgfmt = "A memory request failed.";
            error_code = -0x14;
            line = 0x39e;
          }
          else {
            __ptr_01 = malloc(sVar6);
            *(void **)((long)cvode_mem + 0x5a8) = __ptr_01;
            if (__ptr_01 == (void *)0x0) {
              free(__ptr);
              *(undefined8 *)((long)cvode_mem + 0x598) = 0;
              free(__ptr_00);
              *(undefined8 *)((long)cvode_mem + 0x5a0) = 0;
              msgfmt = "A memory request failed.";
              error_code = -0x14;
              line = 0x3ab;
            }
            else {
              sVar6 = (ulong)uVar5 << 2;
              __ptr_02 = malloc(sVar6);
              *(void **)((long)cvode_mem + 0x570) = __ptr_02;
              if (__ptr_02 == (void *)0x0) {
                free(__ptr);
                *(undefined8 *)((long)cvode_mem + 0x598) = 0;
                free(__ptr_00);
                *(undefined8 *)((long)cvode_mem + 0x5a0) = 0;
                free(__ptr_01);
                *(undefined8 *)((long)cvode_mem + 0x5a8) = 0;
                msgfmt = "A memory request failed.";
                error_code = -0x14;
                line = 0x3ba;
              }
              else {
                __ptr_03 = malloc(sVar6);
                *(void **)((long)cvode_mem + 0x578) = __ptr_03;
                if (__ptr_03 == (void *)0x0) {
                  free(__ptr);
                  *(undefined8 *)((long)cvode_mem + 0x598) = 0;
                  free(__ptr_00);
                  *(undefined8 *)((long)cvode_mem + 0x5a0) = 0;
                  free(__ptr_01);
                  *(undefined8 *)((long)cvode_mem + 0x5a8) = 0;
                  free(__ptr_02);
                  *(undefined8 *)((long)cvode_mem + 0x570) = 0;
                  msgfmt = "A memory request failed.";
                  error_code = -0x14;
                  line = 0x3cb;
                }
                else {
                  pvVar3 = malloc(sVar6);
                  *(void **)((long)cvode_mem + 0x5d0) = pvVar3;
                  if (pvVar3 != (void *)0x0) {
                    for (uVar4 = 0; (uint)nrtfn != uVar4; uVar4 = uVar4 + 1) {
                      *(undefined4 *)((long)__ptr_03 + uVar4 * 4) = 0;
                    }
                    for (uVar4 = 0; (uint)nrtfn != uVar4; uVar4 = uVar4 + 1) {
                      *(undefined4 *)((long)pvVar3 + uVar4 * 4) = 1;
                    }
                    *(ulong *)((long)cvode_mem + 0x3c0) =
                         (ulong)(uVar5 * 3) + *(long *)((long)cvode_mem + 0x3c0);
                    *(ulong *)((long)cvode_mem + 0x3c8) =
                         (ulong)(uVar5 * 3) + *(long *)((long)cvode_mem + 0x3c8);
                    return 0;
                  }
                  free(__ptr);
                  *(undefined8 *)((long)cvode_mem + 0x598) = 0;
                  free(__ptr_00);
                  *(undefined8 *)((long)cvode_mem + 0x5a0) = 0;
                  free(__ptr_01);
                  *(undefined8 *)((long)cvode_mem + 0x5a8) = 0;
                  free(__ptr_02);
                  *(undefined8 *)((long)cvode_mem + 0x570) = 0;
                  free(__ptr_03);
                  *(undefined8 *)((long)cvode_mem + 0x578) = 0;
                  msgfmt = "A memory request failed.";
                  error_code = -0x14;
                  line = 0x3de;
                }
              }
            }
          }
        }
      }
    }
  }
  cvProcessError((CVodeMem)cvode_mem,error_code,line,"CVodeRootInit",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode.c"
                 ,msgfmt);
  return error_code;
}

Assistant:

int CVodeRootInit(void* cvode_mem, int nrtfn, CVRootFn g)
{
  CVodeMem cv_mem;
  int i, nrt;

  /* Check cvode_mem pointer */
  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  nrt = (nrtfn < 0) ? 0 : nrtfn;

  /* If rerunning CVodeRootInit() with a different number of root
     functions (changing number of gfun components), then free
     currently held memory resources */
  if ((nrt != cv_mem->cv_nrtfn) && (cv_mem->cv_nrtfn > 0))
  {
    free(cv_mem->cv_glo);
    cv_mem->cv_glo = NULL;
    free(cv_mem->cv_ghi);
    cv_mem->cv_ghi = NULL;
    free(cv_mem->cv_grout);
    cv_mem->cv_grout = NULL;
    free(cv_mem->cv_iroots);
    cv_mem->cv_iroots = NULL;
    free(cv_mem->cv_rootdir);
    cv_mem->cv_rootdir = NULL;
    free(cv_mem->cv_gactive);
    cv_mem->cv_gactive = NULL;

    cv_mem->cv_lrw -= 3 * (cv_mem->cv_nrtfn);
    cv_mem->cv_liw -= 3 * (cv_mem->cv_nrtfn);
  }

  /* If CVodeRootInit() was called with nrtfn == 0, then set cv_nrtfn to
     zero and cv_gfun to NULL before returning */
  if (nrt == 0)
  {
    cv_mem->cv_nrtfn = nrt;
    cv_mem->cv_gfun  = NULL;
    return (CV_SUCCESS);
  }

  /* If rerunning CVodeRootInit() with the same number of root functions
     (not changing number of gfun components), then check if the root
     function argument has changed */
  /* If g != NULL then return as currently reserved memory resources
     will suffice */
  if (nrt == cv_mem->cv_nrtfn)
  {
    if (g != cv_mem->cv_gfun)
    {
      if (g == NULL)
      {
        free(cv_mem->cv_glo);
        cv_mem->cv_glo = NULL;
        free(cv_mem->cv_ghi);
        cv_mem->cv_ghi = NULL;
        free(cv_mem->cv_grout);
        cv_mem->cv_grout = NULL;
        free(cv_mem->cv_iroots);
        cv_mem->cv_iroots = NULL;
        free(cv_mem->cv_rootdir);
        cv_mem->cv_rootdir = NULL;
        free(cv_mem->cv_gactive);
        cv_mem->cv_gactive = NULL;

        cv_mem->cv_lrw -= 3 * nrt;
        cv_mem->cv_liw -= 3 * nrt;

        cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                       MSGCV_NULL_G);
        return (CV_ILL_INPUT);
      }
      else
      {
        cv_mem->cv_gfun = g;
        return (CV_SUCCESS);
      }
    }
    else { return (CV_SUCCESS); }
  }

  /* Set variable values in CVode memory block */
  cv_mem->cv_nrtfn = nrt;
  if (g == NULL)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_NULL_G);
    return (CV_ILL_INPUT);
  }
  else { cv_mem->cv_gfun = g; }

  /* Allocate necessary memory and return */
  cv_mem->cv_glo = NULL;
  cv_mem->cv_glo = (sunrealtype*)malloc(nrt * sizeof(sunrealtype));
  if (cv_mem->cv_glo == NULL)
  {
    cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGCV_MEM_FAIL);
    return (CV_MEM_FAIL);
  }

  cv_mem->cv_ghi = NULL;
  cv_mem->cv_ghi = (sunrealtype*)malloc(nrt * sizeof(sunrealtype));
  if (cv_mem->cv_ghi == NULL)
  {
    free(cv_mem->cv_glo);
    cv_mem->cv_glo = NULL;
    cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGCV_MEM_FAIL);
    return (CV_MEM_FAIL);
  }

  cv_mem->cv_grout = NULL;
  cv_mem->cv_grout = (sunrealtype*)malloc(nrt * sizeof(sunrealtype));
  if (cv_mem->cv_grout == NULL)
  {
    free(cv_mem->cv_glo);
    cv_mem->cv_glo = NULL;
    free(cv_mem->cv_ghi);
    cv_mem->cv_ghi = NULL;
    cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGCV_MEM_FAIL);
    return (CV_MEM_FAIL);
  }

  cv_mem->cv_iroots = NULL;
  cv_mem->cv_iroots = (int*)malloc(nrt * sizeof(int));
  if (cv_mem->cv_iroots == NULL)
  {
    free(cv_mem->cv_glo);
    cv_mem->cv_glo = NULL;
    free(cv_mem->cv_ghi);
    cv_mem->cv_ghi = NULL;
    free(cv_mem->cv_grout);
    cv_mem->cv_grout = NULL;
    cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGCV_MEM_FAIL);
    return (CV_MEM_FAIL);
  }

  cv_mem->cv_rootdir = NULL;
  cv_mem->cv_rootdir = (int*)malloc(nrt * sizeof(int));
  if (cv_mem->cv_rootdir == NULL)
  {
    free(cv_mem->cv_glo);
    cv_mem->cv_glo = NULL;
    free(cv_mem->cv_ghi);
    cv_mem->cv_ghi = NULL;
    free(cv_mem->cv_grout);
    cv_mem->cv_grout = NULL;
    free(cv_mem->cv_iroots);
    cv_mem->cv_iroots = NULL;
    cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGCV_MEM_FAIL);
    return (CV_MEM_FAIL);
  }

  cv_mem->cv_gactive = NULL;
  cv_mem->cv_gactive = (sunbooleantype*)malloc(nrt * sizeof(sunbooleantype));
  if (cv_mem->cv_gactive == NULL)
  {
    free(cv_mem->cv_glo);
    cv_mem->cv_glo = NULL;
    free(cv_mem->cv_ghi);
    cv_mem->cv_ghi = NULL;
    free(cv_mem->cv_grout);
    cv_mem->cv_grout = NULL;
    free(cv_mem->cv_iroots);
    cv_mem->cv_iroots = NULL;
    free(cv_mem->cv_rootdir);
    cv_mem->cv_rootdir = NULL;
    cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGCV_MEM_FAIL);
    return (CV_MEM_FAIL);
  }

  /* Set default values for rootdir (both directions) */
  for (i = 0; i < nrt; i++) { cv_mem->cv_rootdir[i] = 0; }

  /* Set default values for gactive (all active) */
  for (i = 0; i < nrt; i++) { cv_mem->cv_gactive[i] = SUNTRUE; }

  cv_mem->cv_lrw += 3 * nrt;
  cv_mem->cv_liw += 3 * nrt;

  return (CV_SUCCESS);
}